

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_6(void)

{
  char *buff;
  archive *paVar1;
  archive *a_00;
  size_t s;
  void *p;
  archive *a;
  char *refname;
  char *in_stack_000003f0;
  archive *in_stack_ffffffffffffffd8;
  archive *paVar2;
  char *in_stack_ffffffffffffffe0;
  char *fmt;
  
  fmt = "test_compat_zip_6.zip";
  extract_reference_file(in_stack_000003f0);
  buff = slurpfile((size_t *)&stack0xffffffffffffffe0,fmt);
  paVar1 = archive_read_new();
  assertion_assert((char *)paVar1,(wchar_t)((ulong)buff >> 0x20),(wchar_t)buff,
                   in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  paVar2 = paVar1;
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x14922c,p);
  archive_read_support_format_all(paVar1);
  paVar1 = paVar2;
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar2 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar2,(char *)0x149265,p);
  read_open_memory_seek(paVar1,buff,(size_t)in_stack_ffffffffffffffe0,(size_t)paVar2);
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x1492ad,p);
  compat_zip_6_verify(paVar1);
  archive_read_free((archive *)0x1492c1);
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x1492f0,p);
  a_00 = archive_read_new();
  assertion_assert((char *)a_00,(wchar_t)((ulong)buff >> 0x20),(wchar_t)buff,
                   in_stack_ffffffffffffffe0,paVar1);
  archive_read_support_filter_all(paVar1);
  paVar2 = a_00;
  assertion_equal_int(fmt,(wchar_t)((ulong)a_00 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)a_00,(char *)0x14935c,p);
  archive_read_support_format_all(a_00);
  paVar1 = paVar2;
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar2 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar2,(char *)0x149395,p);
  read_open_memory(paVar1,buff,(size_t)in_stack_ffffffffffffffe0,(size_t)paVar2);
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x1493dd,p);
  compat_zip_6_verify(paVar1);
  archive_read_free((archive *)0x1493f1);
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x149420,p);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_6)
{
	const char *refname = "test_compat_zip_6.zip";
	struct archive *a;
	void *p;
	size_t s;

	extract_reference_file(refname);
	p = slurpfile(&s, refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 7));
	compat_zip_6_verify(a);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, p, s, 7));
	compat_zip_6_verify(a);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	free(p);
}